

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::CurrenciesTest_test_empty_string_is_not_valid_currency_pair_Test::
TestBody(CurrenciesTest_test_empty_string_is_not_valid_currency_pair_Test *this)

{
  byte bVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  string local_90;
  AssertHelper local_70;
  Message local_68 [3];
  allocator<char> local_49;
  string local_48 [39];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  CurrenciesTest_test_empty_string_is_not_valid_currency_pair_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_49);
  bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_48);
  local_21 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_20,
               (AssertionResult *)"Currencies::IsValidCurrencyPair(\"\")","true","false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
               ,0xcb,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(CurrenciesTest, test_empty_string_is_not_valid_currency_pair)
{
    ASSERT_FALSE(Currencies::IsValidCurrencyPair(""));
}